

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChParserOpenSim::initShapes
          (ChParserOpenSim *this,xml_node<char> *node,ChSystem *system)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  char *pcVar7;
  element_type *peVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 hlen;
  pointer pcVar16;
  ChMaterialSurface *pCVar17;
  bool bVar18;
  int iVar19;
  ChBodyAuxRef *pCVar20;
  ChBodyAuxRef *this_00;
  iterator iVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar25;
  long *plVar26;
  ChSphereShape *this_01;
  ChCylinderShape *this_02;
  _Rb_tree_node_base *p_Var27;
  pointer psVar28;
  int iVar29;
  pointer pcVar30;
  _Sp_alloc_shared_tag<std::allocator<chrono::ChVisualMaterial>_> size;
  shared_ptr<chrono::ChVisualShape> *shape;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  float fVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  double dVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  double dVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  double dVar109;
  double dVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  shared_ptr<chrono::ChVisualMaterial> vis_mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
  body_info_pair;
  body_collision_struct body_info;
  shared_ptr<chrono::ChSphereShape> sphere;
  shared_ptr<chrono::ChCylinderShape> cylinder;
  ChCoordsys<double> linkCoords;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  double local_2a8;
  double local_298;
  undefined1 local_288 [8];
  undefined1 auStack_280 [8];
  undefined1 auStack_278 [16];
  double dStack_268;
  ChQuaternion<double> aCStack_260 [3];
  ChMaterialSurface *local_200;
  ChVisualMaterial *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1f0 [2];
  pointer local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
  local_1d8;
  ChBodyAuxRef *local_188;
  vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
  local_180;
  ulong local_168;
  int local_160;
  ChSphereShape *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  ChQuaternion<double> local_148;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::ChVisualShape> local_118;
  shared_ptr<chrono::ChVisualMaterial> local_108;
  shared_ptr<chrono::ChVisualShape> local_f8;
  shared_ptr<chrono::ChVisualMaterial> local_e8;
  ChSystem *local_d8;
  pointer local_d0;
  ChFrame<double> local_c8;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  long lVar24;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  
  local_d8 = system;
  if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Creating collision and visualization shapes ",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  local_d0 = (this->m_jointList).
             super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar28 = (this->m_jointList).
            super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar28 == local_d0) {
    fVar42 = 0.0;
  }
  else {
    local_200 = (ChMaterialSurface *)0x0;
    do {
      peVar5 = (psVar28->super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = (psVar28->super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_1e0 = psVar28;
      (*(peVar5->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3f])
                (&local_c8,peVar5);
      if (peVar5->Body1 == (ChBodyFrame *)0x0) {
        pCVar20 = (ChBodyAuxRef *)0x0;
      }
      else {
        pCVar20 = (ChBodyAuxRef *)
                  __dynamic_cast(peVar5->Body1,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78);
      }
      if (peVar5->Body2 == (ChBodyFrame *)0x0) {
        this_00 = (ChBodyAuxRef *)0x0;
      }
      else {
        this_00 = (ChBodyAuxRef *)
                  __dynamic_cast(peVar5->Body2,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78);
      }
      std::__cxx11::string::string
                ((string *)local_288,
                 (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1d8);
      iVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                       *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      if (local_288 != (undefined1  [8])auStack_278) {
        operator_delete((void *)local_288,auStack_278._0_8_ + 1);
      }
      if (iVar21._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
        std::__cxx11::string::string
                  ((string *)local_288,
                   (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        pmVar22->body = pCVar20;
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
      }
      std::__cxx11::string::string
                ((string *)local_288,
                 (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1d8);
      iVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                       *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      if (local_288 != (undefined1  [8])auStack_278) {
        operator_delete((void *)local_288,auStack_278._0_8_ + 1);
      }
      if (iVar21._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
        std::__cxx11::string::string
                  ((string *)local_288,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        pmVar22->body = this_00;
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
      }
      std::__cxx11::string::string
                ((string *)local_288,
                 (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1d8);
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      if (local_288 != (undefined1  [8])auStack_278) {
        operator_delete((void *)local_288,auStack_278._0_8_ + 1);
      }
      std::__cxx11::string::string
                ((string *)local_288,
                 (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&local_1d8);
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      if (local_288 != (undefined1  [8])auStack_278) {
        operator_delete((void *)local_288,auStack_278._0_8_ + 1);
      }
      bVar18 = ChBody::GetBodyFixed(&pCVar20->super_ChBody);
      if (bVar18) {
        iVar19 = 0;
        pmVar22->level = 0;
      }
      else {
        iVar19 = pmVar22->level;
      }
      pmVar23->level = iVar19 + 1U;
      iVar29 = (int)local_200;
      local_200 = (ChMaterialSurface *)((ulong)local_200 & 0xffffffff);
      if (iVar29 <= iVar19) {
        local_200 = (ChMaterialSurface *)(ulong)(iVar19 + 1U);
      }
      ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)local_288,pCVar20);
      uVar10 = auStack_278._8_8_;
      local_2d8 = auStack_280._0_16_;
      iVar19 = (*(pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(pCVar20)
      ;
      lVar24 = CONCAT44(extraout_var,iVar19);
      dVar43 = local_c8.coord.pos.m_data[0] - *(double *)(lVar24 + 0x10);
      dVar92 = (double)local_c8._vptr_ChFrame - *(double *)(lVar24 + 8);
      dVar91 = local_c8.coord.pos.m_data[1] - *(double *)(lVar24 + 0x18);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(lVar24 + 0x50);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar92;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar43 * *(double *)(lVar24 + 0x68);
      auVar40 = vfmadd231sd_fma(auVar35,auVar39,auVar40);
      auVar58._0_8_ = dVar43 * *(double *)(lVar24 + 0x58);
      auVar58._8_8_ = dVar43 * *(double *)(lVar24 + 0x60);
      auVar44._8_8_ = dVar92;
      auVar44._0_8_ = dVar92;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(lVar24 + 0x80);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar91;
      auVar35 = vfmadd231sd_fma(auVar40,auVar71,auVar2);
      auVar72._8_8_ = dVar91;
      auVar72._0_8_ = dVar91;
      auVar40 = vfmadd132pd_fma(auVar44,auVar58,*(undefined1 (*) [16])(lVar24 + 0x40));
      auVar39 = vfmadd132pd_fma(auVar72,auVar40,*(undefined1 (*) [16])(lVar24 + 0x70));
      dVar43 = auVar35._0_8_ - (double)uVar10;
      auVar2 = vsubpd_avx(auVar39,local_2d8);
      auVar79._0_8_ = auVar2._0_8_ * auVar2._0_8_;
      auVar79._8_8_ = auVar2._8_8_ * auVar2._8_8_;
      auVar40 = vshufpd_avx(auVar79,auVar79,1);
      auVar40 = vfmadd231sd_fma(auVar40,auVar2,auVar2);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar43;
      auVar40 = vfmadd231sd_fma(auVar40,auVar45,auVar45);
      auVar40 = vsqrtsd_avx(auVar40,auVar40);
      if (1e-05 < auVar40._0_8_) {
        auVar40 = vsubpd_avx(local_2d8,auVar39);
        uVar9 = vcmppd_avx512vl(auVar40,_DAT_00952100,0);
        dVar92 = (double)uVar10 - auVar35._0_8_;
        dVar91 = auVar40._0_8_;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = dVar92;
        if (((uVar9 & 1) == 0) || ((uVar9 & 3) >> 1 == 0)) {
LAB_0092e062:
          auVar39 = vshufpd_avx(auVar40,auVar40,1);
          dVar95 = auVar39._0_8_;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = dVar95 * dVar95;
          auVar39 = vfmadd231sd_fma(auVar86,auVar40,auVar40);
          auVar39 = vfmadd231sd_fma(auVar39,auVar65,auVar65);
          auVar39 = vsqrtsd_avx(auVar39,auVar39);
          dVar85 = 1.0 / auVar39._0_8_;
          bVar18 = 2.2250738585072014e-308 <= auVar39._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = (ulong)bVar18 * (long)(dVar95 * dVar85);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = (ulong)bVar18 * (long)(dVar92 * dVar85);
          auVar34._0_8_ =
               (ulong)bVar18 * (long)(dVar91 * dVar85) + (ulong)!bVar18 * 0x3ff0000000000000;
          auVar34._8_8_ = 0;
        }
        else {
          auVar34 = ZEXT816(0x3ff0000000000000);
          auVar32 = ZEXT816(0) << 0x40;
          auVar33 = ZEXT816(0) << 0x40;
          if ((dVar92 != 0.0) || (NAN(dVar92))) goto LAB_0092e062;
        }
        auVar35 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar32,auVar33);
        dVar85 = auVar35._0_8_;
        dVar78 = auVar34._0_8_;
        dVar109 = auVar32._0_8_;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = dVar78 * -0.0;
        auVar39 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar33,auVar102);
        dVar95 = auVar39._0_8_;
        dVar92 = dVar78 + dVar109 * -0.0;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = dVar95 * dVar95;
        auVar39 = vfmadd231sd_fma(auVar107,auVar35,auVar35);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = dVar92;
        auVar39 = vfmadd231sd_fma(auVar39,auVar96,auVar96);
        auVar39 = vsqrtsd_avx(auVar39,auVar39);
        dVar101 = auVar39._0_8_;
        dVar110 = auVar33._0_8_;
        if (dVar101 < 0.0001) {
          dVar95 = dVar110 + dVar78 * -0.0;
          auVar35 = vfmsub213sd_fma(ZEXT816(0),auVar34,auVar32);
          dVar92 = auVar35._0_8_;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = dVar110 * -0.0;
          auVar39 = vfmadd231sd_fma(auVar87,auVar32,ZEXT816(0));
          dVar85 = auVar39._0_8_;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = dVar95 * dVar95;
          auVar39 = vfmadd231sd_fma(auVar103,auVar39,auVar39);
          auVar39 = vfmadd231sd_fma(auVar39,auVar35,auVar35);
          auVar39 = vsqrtsd_avx(auVar39,auVar39);
          dVar101 = auVar39._0_8_;
        }
        auVar41 = vpermpd_avx2(ZEXT1632(auVar2),0xd0);
        dVar101 = 1.0 / dVar101;
        dVar85 = dVar101 * dVar85;
        dVar92 = dVar101 * dVar92;
        dVar101 = dVar101 * dVar95;
        aCStack_260[0].m_data._0_16_ = ZEXT816(0);
        aCStack_260[0].m_data = (double  [4])ZEXT1632(aCStack_260[0].m_data._0_16_);
        auVar97._0_8_ = dVar91 * dVar91;
        auVar97._8_8_ = auVar40._8_8_ * auVar40._8_8_;
        local_288 = (undefined1  [8])0x3f947ae147ae147b;
        auVar2 = vshufpd_avx(auVar97,auVar97,1);
        auVar40 = vfmadd231sd_fma(auVar2,auVar40,auVar40);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = dVar92;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = dVar110 * dVar85;
        auVar2 = vfmsub231sd_fma(auVar93,auVar88,auVar34);
        auVar104._8_8_ = 0;
        auVar104._0_8_ = dVar109 * dVar92;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = dVar101;
        auVar39 = vfmsub231sd_fma(auVar104,auVar112,auVar33);
        dVar95 = auVar39._0_8_;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = dVar85;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = dVar101 * dVar78;
        auVar39 = vfmsub231sd_fma(auVar115,auVar108,auVar32);
        auVar40 = vfmadd213sd_fma(auVar65,auVar65,auVar40);
        auVar40 = vsqrtsd_avx(auVar40,auVar40);
        auVar56._8_8_ = dVar43;
        auVar56._0_8_ = dVar43;
        auVar56._16_8_ = dVar43;
        auVar56._24_8_ = dVar43;
        auVar41 = vblendpd_avx(auVar41,ZEXT1632(auVar40),1);
        auVar41 = vblendpd_avx(auVar41,auVar56,8);
        auVar57._8_8_ = 0x3fe0000000000000;
        auVar57._0_8_ = 0x3fe0000000000000;
        auVar57._16_8_ = 0x3fe0000000000000;
        auVar57._24_8_ = 0x3fe0000000000000;
        _auStack_280 = vmulpd_avx512vl(auVar41,auVar57);
        dVar91 = auVar2._0_8_;
        dVar43 = dVar92 + dVar78 + dVar91;
        dVar114 = auVar39._0_8_;
        if (0.0 <= dVar43) {
          dVar43 = dVar43 + 1.0;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar43;
          if (dVar43 < 0.0) {
            dVar43 = sqrt(dVar43);
          }
          else {
            auVar40 = vsqrtsd_avx(auVar47,auVar47);
            dVar43 = auVar40._0_8_;
          }
          local_298 = dVar43 * 0.5;
          dVar43 = 0.5 / dVar43;
          local_2e8._8_8_ = 0;
          local_2e8._0_8_ = (dVar114 - dVar101) * dVar43;
          local_2a8 = (dVar109 - dVar95) * dVar43;
          local_2d8._8_8_ = 0;
          local_2d8._0_8_ = (dVar85 - dVar110) * dVar43;
        }
        else {
          if (dVar91 <= dVar78) {
            if (dVar78 < dVar92) goto LAB_0092e22d;
            dVar43 = ((dVar78 - dVar91) - dVar92) + 1.0;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              dVar43 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar49,auVar49);
              dVar43 = auVar40._0_8_;
            }
            local_298 = 0.5 / dVar43;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = dVar43 * 0.5;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = (dVar109 + dVar95) * local_298;
            local_2a8 = (dVar110 + dVar85) * local_298;
            dVar85 = dVar114 - dVar101;
          }
          else if (dVar91 < dVar92) {
LAB_0092e22d:
            dVar43 = ((dVar92 - dVar78) - dVar91) + 1.0;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              local_298 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar48,auVar48);
              local_298 = auVar40._0_8_;
            }
            local_2a8 = local_298 * 0.5;
            local_298 = 0.5 / local_298;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = (dVar110 + dVar85) * local_298;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = (dVar101 + dVar114) * local_298;
            dVar85 = dVar109 - dVar95;
          }
          else {
            dVar43 = ((dVar91 - dVar92) - dVar78) + 1.0;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              dVar43 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar46,auVar46);
              dVar43 = auVar40._0_8_;
            }
            local_298 = 0.5 / dVar43;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = dVar43 * 0.5;
            local_2a8 = (dVar101 + dVar114) * local_298;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = (dVar109 + dVar95) * local_298;
            dVar85 = dVar85 - dVar110;
          }
          local_298 = dVar85 * local_298;
        }
        Q_from_AngZ((ChQuaternion<double> *)&local_1d8,-1.5707963267948966);
        auVar13._8_8_ = local_1d8.first._M_string_length;
        auVar13._0_8_ = local_1d8.first._M_dataplus._M_p;
        auVar13._16_8_ = local_1d8.first.field_2._M_allocated_capacity;
        auVar13._24_8_ = local_1d8.first.field_2._8_8_;
        auVar66._8_8_ = local_2a8;
        auVar66._0_8_ = local_2a8;
        auVar69._16_8_ = local_2a8;
        auVar69._0_16_ = auVar66;
        auVar69._24_8_ = local_2a8;
        auVar105._8_8_ = local_298;
        auVar105._0_8_ = local_298;
        auVar105._16_8_ = local_298;
        auVar105._24_8_ = local_298;
        auVar59._0_8_ = local_2e8._0_8_ ^ 0x8000000000000000;
        auVar59._8_8_ = local_2e8._8_8_ ^ 0x8000000000000000;
        auVar57 = vpermpd_avx2(auVar13,1);
        auVar56 = vpermpd_avx2(ZEXT1632(CONCAT88(local_1d8.first.field_2._8_8_,
                                                 local_1d8.first.field_2._M_allocated_capacity)),
                               0x15);
        auVar40 = vunpcklpd_avx(auVar59,local_2e8);
        auVar41._16_16_ = local_2d8;
        auVar41._0_16_ = auVar40;
        auVar41 = vblendpd_avx(auVar41,auVar69,8);
        auVar83._0_8_ = auVar57._0_8_ * auVar41._0_8_;
        auVar83._8_8_ = auVar57._8_8_ * auVar41._8_8_;
        auVar83._16_8_ = auVar57._16_8_ * auVar41._16_8_;
        auVar83._24_8_ = auVar57._24_8_ * auVar41._24_8_;
        auVar2 = vfmadd213pd_fma(auVar105,auVar13,auVar83);
        auVar40 = vunpcklpd_avx(local_2d8,auVar66);
        auVar76._24_8_ = local_1d8.first._M_string_length;
        auVar76._16_8_ = local_1d8.first._M_string_length;
        auVar76._8_8_ = local_1d8.first.field_2._M_allocated_capacity;
        auVar76._0_8_ = local_1d8.first.field_2._0_8_;
        auVar57 = ZEXT1632(CONCAT88(auVar40._8_8_ ^ 0x8000000000000000,
                                    auVar40._0_8_ ^ 0x8000000000000000));
        auVar41 = vblendpd_avx(auVar57,auVar69,4);
        auVar41 = vpermpd_avx2(auVar41,0x24);
        auVar40 = vfmadd213pd_fma(auVar76,auVar41,ZEXT1632(auVar2));
        auVar41 = vpermt2pd_avx512f(_DAT_009553a0,auVar57);
        auVar40 = vfmadd213pd_fma(auVar41,auVar56,ZEXT1632(auVar40));
        aCStack_260[0].m_data = (double  [4])ZEXT1632(auVar40);
        std::__cxx11::string::string
                  ((string *)&local_1d8,
                   (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_188);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,&local_1d8.first);
        std::
        vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
        ::push_back(&pmVar22->cylinders,(value_type *)local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.first._M_dataplus._M_p != &local_1d8.first.field_2) {
          operator_delete(local_1d8.first._M_dataplus._M_p,
                          local_1d8.first.field_2._M_allocated_capacity + 1);
        }
      }
      iVar19 = (*(this_00->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(this_00)
      ;
      lVar24 = CONCAT44(extraout_var_00,iVar19);
      dVar43 = local_c8.coord.pos.m_data[0] - *(double *)(lVar24 + 0x10);
      dVar92 = (double)local_c8._vptr_ChFrame - *(double *)(lVar24 + 8);
      dVar91 = local_c8.coord.pos.m_data[1] - *(double *)(lVar24 + 0x18);
      auVar73._0_8_ = dVar43 * *(double *)(lVar24 + 0x58);
      auVar73._8_8_ = dVar43 * *(double *)(lVar24 + 0x60);
      auVar80._8_8_ = dVar92;
      auVar80._0_8_ = dVar92;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(lVar24 + 0x50);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar92;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar43 * *(double *)(lVar24 + 0x68);
      auVar2 = vfmadd231sd_fma(auVar60,auVar50,auVar3);
      auVar40 = vfmadd132pd_fma(auVar80,auVar73,*(undefined1 (*) [16])(lVar24 + 0x40));
      auVar74._8_8_ = dVar91;
      auVar74._0_8_ = dVar91;
      auVar39 = vfmadd132pd_fma(auVar74,auVar40,*(undefined1 (*) [16])(lVar24 + 0x70));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(lVar24 + 0x80);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar91;
      auVar40 = vfmadd231sd_fma(auVar2,auVar67,auVar4);
      ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)local_288,this_00);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = auStack_278._8_8_;
      auVar2 = vsubpd_avx(_auStack_280,auVar39);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = auVar40._0_8_;
      auVar35 = vsubsd_avx512f(auVar61,auVar117);
      auVar40 = vshufpd_avx(auVar2,auVar2,1);
      dVar43 = auVar40._0_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = dVar43 * dVar43;
      auVar40 = vfmadd231sd_fma(auVar75,auVar2,auVar2);
      auVar40 = vfmadd231sd_fma(auVar40,auVar35,auVar35);
      auVar40 = vsqrtsd_avx(auVar40,auVar40);
      if (1e-05 < auVar40._0_8_) {
        uVar10 = vcmppd_avx512vl(auVar2,_DAT_00952100,0);
        dVar92 = 1.0 / auVar40._0_8_;
        bVar31 = ((byte)uVar10 & 3) == 3;
        bVar18 = auVar35._0_8_ == 0.0;
        auVar36._0_8_ =
             (double)((ulong)(bVar18 && bVar31) * 0x3ff0000000000000 +
                     (ulong)(!bVar18 || !bVar31) * (long)(auVar2._0_8_ * dVar92));
        auVar36._8_8_ = 0;
        dVar85 = (double)((ulong)(!bVar18 || !bVar31) * (long)(auVar35._0_8_ * dVar92));
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar85;
        dVar101 = (double)((ulong)(!bVar18 || !bVar31) * (long)(dVar43 * dVar92));
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar101;
        auVar35 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar38,auVar37);
        dVar91 = auVar35._0_8_;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = auVar36._0_8_ * -0.0;
        auVar2 = vfmadd231sd_fma(auVar89,ZEXT816(0) << 0x40,auVar37);
        dVar92 = auVar2._0_8_;
        dVar43 = auVar36._0_8_ + dVar101 * -0.0;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = dVar92 * dVar92;
        auVar2 = vfmadd231sd_fma(auVar98,auVar35,auVar35);
        auVar94._8_8_ = 0;
        auVar94._0_8_ = dVar43;
        auVar2 = vfmadd231sd_fma(auVar2,auVar94,auVar94);
        auVar2 = vsqrtsd_avx(auVar2,auVar2);
        dVar95 = auVar2._0_8_;
        if (dVar95 < 0.0001) {
          auVar35 = vfmsub213sd_fma(ZEXT816(0),auVar36,auVar38);
          dVar43 = auVar35._0_8_;
          dVar92 = dVar85 + auVar36._0_8_ * -0.0;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = dVar85 * -0.0;
          auVar2 = vfmadd231sd_fma(auVar81,auVar38,ZEXT816(0) << 0x40);
          dVar91 = auVar2._0_8_;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = dVar92 * dVar92;
          auVar2 = vfmadd231sd_fma(auVar99,auVar2,auVar2);
          auVar2 = vfmadd231sd_fma(auVar2,auVar35,auVar35);
          auVar2 = vsqrtsd_avx(auVar2,auVar2);
          dVar95 = auVar2._0_8_;
        }
        auVar2 = vsubpd_avx(auVar39,_auStack_280);
        auVar39 = vsubsd_avx512f(auVar117,auVar61);
        auVar41 = vpermpd_avx2(ZEXT1632(auVar2),0xd0);
        auVar63._0_8_ = auVar39._0_8_;
        auVar63._8_8_ = auVar63._0_8_;
        auVar63._16_8_ = auVar63._0_8_;
        auVar63._24_8_ = auVar63._0_8_;
        auVar41 = vblendpd_avx(auVar41,ZEXT1632(auVar40),1);
        auVar41 = vblendpd_avx(auVar41,auVar63,8);
        auVar12._8_8_ = 0x3fe0000000000000;
        auVar12._0_8_ = 0x3fe0000000000000;
        auVar12._16_8_ = 0x3fe0000000000000;
        auVar12._24_8_ = 0x3fe0000000000000;
        _auStack_280 = vmulpd_avx512vl(auVar41,auVar12);
        dVar95 = 1.0 / dVar95;
        dVar91 = dVar91 * dVar95;
        dVar92 = dVar92 * dVar95;
        dVar43 = dVar43 * dVar95;
        aCStack_260[0].m_data._0_16_ = ZEXT816(0);
        aCStack_260[0].m_data = (double  [4])ZEXT1632(aCStack_260[0].m_data._0_16_);
        local_288 = (undefined1  [8])0x3f947ae147ae147b;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = dVar43;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = dVar85 * dVar91;
        auVar40 = vfmsub231sd_fma(auVar90,auVar82,auVar36);
        auVar100._8_8_ = 0;
        auVar100._0_8_ = dVar101 * dVar43;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = dVar92;
        auVar2 = vfmsub231sd_fma(auVar100,auVar113,auVar37);
        dVar109 = auVar2._0_8_;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = dVar91;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = dVar92 * auVar36._0_8_;
        auVar2 = vfmsub231sd_fma(auVar116,auVar111,auVar38);
        dVar78 = auVar40._0_8_;
        dVar95 = dVar43 + auVar36._0_8_ + dVar78;
        dVar110 = auVar2._0_8_;
        if (0.0 <= dVar95) {
          dVar95 = dVar95 + 1.0;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = dVar95;
          if (dVar95 < 0.0) {
            dVar43 = sqrt(dVar95);
          }
          else {
            auVar40 = vsqrtsd_avx(auVar52,auVar52);
            dVar43 = auVar40._0_8_;
          }
          local_298 = dVar43 * 0.5;
          dVar43 = 0.5 / dVar43;
          local_2e8._8_8_ = 0;
          local_2e8._0_8_ = (dVar110 - dVar92) * dVar43;
          local_2a8 = (dVar101 - dVar109) * dVar43;
          local_2d8._8_8_ = 0;
          local_2d8._0_8_ = (dVar91 - dVar85) * dVar43;
        }
        else {
          if (dVar78 <= auVar36._0_8_) {
            if (auVar36._0_8_ < dVar43) goto LAB_0092e86b;
            dVar43 = ((auVar36._0_8_ - dVar78) - dVar43) + 1.0;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              dVar43 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar54,auVar54);
              dVar43 = auVar40._0_8_;
            }
            local_298 = 0.5 / dVar43;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = dVar43 * 0.5;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = (dVar101 + dVar109) * local_298;
            local_2a8 = (dVar85 + dVar91) * local_298;
            dVar91 = dVar110 - dVar92;
          }
          else if (dVar78 < dVar43) {
LAB_0092e86b:
            dVar43 = ((dVar43 - auVar36._0_8_) - dVar78) + 1.0;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              local_298 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar53,auVar53);
              local_298 = auVar40._0_8_;
            }
            local_2a8 = local_298 * 0.5;
            local_298 = 0.5 / local_298;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = (dVar85 + dVar91) * local_298;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = (dVar92 + dVar110) * local_298;
            dVar91 = dVar101 - dVar109;
          }
          else {
            dVar43 = ((dVar78 - dVar43) - auVar36._0_8_) + 1.0;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = dVar43;
            if (dVar43 < 0.0) {
              dVar43 = sqrt(dVar43);
            }
            else {
              auVar40 = vsqrtsd_avx(auVar51,auVar51);
              dVar43 = auVar40._0_8_;
            }
            local_298 = 0.5 / dVar43;
            local_2d8._8_8_ = 0;
            local_2d8._0_8_ = dVar43 * 0.5;
            local_2a8 = (dVar92 + dVar110) * local_298;
            local_2e8._8_8_ = 0;
            local_2e8._0_8_ = (dVar101 + dVar109) * local_298;
            dVar91 = dVar91 - dVar85;
          }
          local_298 = dVar91 * local_298;
        }
        Q_from_AngZ((ChQuaternion<double> *)&local_1d8,-1.5707963267948966);
        auVar14._8_8_ = local_1d8.first._M_string_length;
        auVar14._0_8_ = local_1d8.first._M_dataplus._M_p;
        auVar14._16_8_ = local_1d8.first.field_2._M_allocated_capacity;
        auVar14._24_8_ = local_1d8.first.field_2._8_8_;
        auVar68._8_8_ = local_2a8;
        auVar68._0_8_ = local_2a8;
        auVar70._16_8_ = local_2a8;
        auVar70._0_16_ = auVar68;
        auVar70._24_8_ = local_2a8;
        auVar106._8_8_ = local_298;
        auVar106._0_8_ = local_298;
        auVar106._16_8_ = local_298;
        auVar106._24_8_ = local_298;
        auVar62._0_8_ = local_2e8._0_8_ ^ 0x8000000000000000;
        auVar62._8_8_ = local_2e8._8_8_ ^ 0x8000000000000000;
        auVar57 = vpermpd_avx2(auVar14,1);
        auVar56 = vpermpd_avx2(ZEXT1632(CONCAT88(local_1d8.first.field_2._8_8_,
                                                 local_1d8.first.field_2._M_allocated_capacity)),
                               0x15);
        auVar40 = vunpcklpd_avx(auVar62,local_2e8);
        auVar64._16_16_ = local_2d8;
        auVar64._0_16_ = auVar40;
        auVar41 = vblendpd_avx(auVar64,auVar70,8);
        auVar84._0_8_ = auVar57._0_8_ * auVar41._0_8_;
        auVar84._8_8_ = auVar57._8_8_ * auVar41._8_8_;
        auVar84._16_8_ = auVar57._16_8_ * auVar41._16_8_;
        auVar84._24_8_ = auVar57._24_8_ * auVar41._24_8_;
        auVar2 = vfmadd213pd_fma(auVar106,auVar14,auVar84);
        auVar40 = vunpcklpd_avx(local_2d8,auVar68);
        auVar77._24_8_ = local_1d8.first._M_string_length;
        auVar77._16_8_ = local_1d8.first._M_string_length;
        auVar77._8_8_ = local_1d8.first.field_2._M_allocated_capacity;
        auVar77._0_8_ = local_1d8.first.field_2._0_8_;
        auVar57 = ZEXT1632(CONCAT88(auVar40._8_8_ ^ 0x8000000000000000,
                                    auVar40._0_8_ ^ 0x8000000000000000));
        auVar41 = vblendpd_avx(auVar57,auVar70,4);
        auVar41 = vpermpd_avx2(auVar41,0x24);
        auVar40 = vfmadd213pd_fma(auVar77,auVar41,ZEXT1632(auVar2));
        auVar41 = vpermt2pd_avx512f(_DAT_009553a0,auVar57);
        auVar40 = vfmadd213pd_fma(auVar41,auVar56,ZEXT1632(auVar40));
        aCStack_260[0].m_data = (double  [4])ZEXT1632(auVar40);
        std::__cxx11::string::string
                  ((string *)&local_1d8,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_188);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,&local_1d8.first);
        std::
        vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
        ::push_back(&pmVar22->cylinders,(value_type *)local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.first._M_dataplus._M_p != &local_1d8.first.field_2) {
          operator_delete(local_1d8.first._M_dataplus._M_p,
                          local_1d8.first.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->m_verbose == true) {
        pcVar7 = (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb712e0);
        }
        else {
          sVar25 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar25);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," family is ",0xb);
        std::__cxx11::string::string
                  ((string *)local_288,
                   (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        plVar26 = (long *)std::ostream::operator<<(&std::cout,pmVar22->family);
        std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
        std::ostream::put((char)plVar26);
        std::ostream::flush();
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
      }
      iVar19 = (*(pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])(pCVar20);
      if ((char)iVar19 == '\0') {
LAB_0092ed72:
        if (this->m_verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting ",8);
          pcVar7 = (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb712e0);
          }
          else {
            sVar25 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar25);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," to family ",0xb);
          plVar26 = (long *)std::ostream::operator<<(&std::cout,this->m_family_1);
          std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
          std::ostream::put((char)plVar26);
          std::ostream::flush();
        }
        iVar19 = this->m_family_1;
        std::__cxx11::string::string
                  ((string *)local_288,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        pmVar22->family = iVar19;
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
        iVar19 = this->m_family_2;
        std::__cxx11::string::string
                  ((string *)local_288,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      }
      else {
        std::__cxx11::string::string
                  ((string *)local_288,
                   (pCVar20->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        iVar19 = pmVar22->family;
        iVar29 = this->m_family_2;
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
        if (iVar19 == iVar29) goto LAB_0092ed72;
        if (this->m_verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting ",8);
          pcVar7 = (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p;
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb712e0);
          }
          else {
            sVar25 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar25);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," to family ",0xb);
          plVar26 = (long *)std::ostream::operator<<(&std::cout,this->m_family_2);
          std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
          std::ostream::put((char)plVar26);
          std::ostream::flush();
        }
        iVar19 = this->m_family_2;
        std::__cxx11::string::string
                  ((string *)local_288,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
        pmVar22->family = iVar19;
        if (local_288 != (undefined1  [8])auStack_278) {
          operator_delete((void *)local_288,auStack_278._0_8_ + 1);
        }
        iVar19 = this->m_family_1;
        std::__cxx11::string::string
                  ((string *)local_288,
                   (this_00->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                   (allocator *)&local_1d8);
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                                *)body_collision_info_abi_cxx11_,(key_type *)local_288);
      }
      pmVar22->family_mask_nocollide = iVar19;
      if (local_288 != (undefined1  [8])auStack_278) {
        operator_delete((void *)local_288,auStack_278._0_8_ + 1);
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      psVar28 = local_1e0 + 1;
    } while (psVar28 != local_d0);
    fVar42 = (float)(int)local_200;
  }
  local_1e0 = (pointer)CONCAT44(local_1e0._4_4_,fVar42);
  if (body_collision_info_abi_cxx11_._24_8_ != 0xb70148) {
    p_Var27 = (_Rb_tree_node_base *)body_collision_info_abi_cxx11_._24_8_;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
      ::pair(&local_1d8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
              *)(p_Var27 + 1));
      local_188 = local_1d8.second.body;
      std::
      vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
      ::vector(&local_180,&local_1d8.second.cylinders);
      iVar19 = local_1d8.second.level;
      local_160 = local_1d8.second.level;
      local_168._0_4_ = local_1d8.second.family;
      local_168._4_4_ = local_1d8.second.family_mask_nocollide;
      if (this->m_visType == PRIMITIVES) {
        local_1f8 = (ChVisualMaterial *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>>
                  (a_Stack_1f0,&local_1f8,(allocator<chrono::ChVisualMaterial> *)local_288);
        local_288._4_4_ = 1.0 - (float)iVar19 / local_1e0._0_4_;
        local_288._0_4_ = (float)iVar19 / local_1e0._0_4_;
        auVar15._28_4_ = 0;
        auVar15._0_28_ = stack0xfffffffffffffd84;
        _auStack_280 = auVar15 << 0x20;
        size._M_a = (allocator<chrono::ChVisualMaterial> *)local_288;
        ChVisualMaterial::SetDiffuseColor(local_1f8,(ChColor *)local_288);
        this_01 = (ChSphereShape *)
                  ChVisualShape::operator_new((ChVisualShape *)0x38,(size_t)size._M_a);
        ChSphereShape::ChSphereShape(this_01);
        local_158 = this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChSphereShape*>
                  (&_Stack_150,this_01);
        (local_158->gsphere).rad = 0.1;
        local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_1f8;
        local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = a_Stack_1f0[0]._M_pi;
        if (a_Stack_1f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_1f0[0]._M_pi)->_M_use_count = (a_Stack_1f0[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_1f0[0]._M_pi)->_M_use_count = (a_Stack_1f0[0]._M_pi)->_M_use_count + 1;
          }
        }
        ChVisualShape::AddMaterial(&local_158->super_ChVisualShape,&local_e8);
        if (local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.
                     super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pCVar20 = local_188;
        local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_158->super_ChVisualShape;
        local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Stack_150._M_pi;
        if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_150._M_pi)->_M_use_count = (_Stack_150._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_150._M_pi)->_M_use_count = (_Stack_150._M_pi)->_M_use_count + 1;
          }
        }
        ChBodyAuxRef::GetFrame_COG_to_REF(&local_c8,local_188);
        local_148.m_data[0] = 1.0;
        local_148.m_data[3] = 0.0;
        local_148.m_data[1] = 0.0;
        local_148.m_data[2] = 0.0;
        local_288 = (undefined1  [8])&PTR__ChFrame_00b03780;
        auStack_278._0_8_ = local_c8.coord.pos.m_data[1];
        auStack_280 = (undefined1  [8])local_c8.coord.pos.m_data[0];
        auStack_278._8_8_ = local_c8.coord.pos.m_data[2];
        dStack_268 = 1.0;
        aCStack_260[0].m_data[2] = 0.0;
        aCStack_260[0].m_data._0_16_ = ZEXT816(0);
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(aCStack_260[0].m_data + 3),&local_148)
        ;
        shape = &local_f8;
        ChPhysicsItem::AddVisualShape((ChPhysicsItem *)pCVar20,shape,(ChFrame<double> *)local_288);
        pcVar30 = local_180.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar16 = local_180.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          pcVar30 = local_180.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar16 = local_180.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pcVar30 != pcVar16; pcVar30 = pcVar30 + 1) {
          local_c8._vptr_ChFrame = (_func_int **)pcVar30->rad;
          local_c8.coord.pos.m_data[0] = pcVar30->hlen;
          local_c8.coord.pos.m_data[1] = (pcVar30->pos).m_data[0];
          local_c8.coord.pos.m_data[2] = (pcVar30->pos).m_data[1];
          local_c8.coord.rot.m_data[0] = (pcVar30->pos).m_data[2];
          local_c8.coord.rot.m_data[1] = (pcVar30->rot).m_data[0];
          local_c8.coord.rot.m_data[2] = (pcVar30->rot).m_data[1];
          local_c8.coord.rot.m_data[3] = (pcVar30->rot).m_data[2];
          local_c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (pcVar30->rot).m_data[3];
          this_02 = (ChCylinderShape *)
                    ChVisualShape::operator_new((ChVisualShape *)0x68,(size_t)shape);
          ChCylinderShape::ChCylinderShape(this_02);
          local_148.m_data[0] = (double)this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCylinderShape*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148.m_data + 1),this_02);
          ((ChCylinder *)((long)local_148.m_data[0] + 0x28))->rad = (double)local_c8._vptr_ChFrame;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_c8.coord.pos.m_data[0];
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p1).m_data[0] = 0.0;
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p1).m_data[1] =
               local_c8.coord.pos.m_data[0];
          auVar11._8_8_ = 0x8000000000000000;
          auVar11._0_8_ = 0x8000000000000000;
          auVar40 = vxorpd_avx512vl(auVar55,auVar11);
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p1).m_data[2] = 0.0;
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p2).m_data[0] = 0.0;
          dVar43 = (double)vmovlpd_avx(auVar40);
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p2).m_data[1] = dVar43;
          (((ChCylinder *)((long)local_148.m_data[0] + 0x28))->p2).m_data[2] = 0.0;
          local_108.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = local_1f8;
          local_108.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = a_Stack_1f0[0]._M_pi;
          if (a_Stack_1f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (a_Stack_1f0[0]._M_pi)->_M_use_count = (a_Stack_1f0[0]._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (a_Stack_1f0[0]._M_pi)->_M_use_count = (a_Stack_1f0[0]._M_pi)->_M_use_count + 1;
            }
          }
          ChVisualShape::AddMaterial((ChVisualShape *)local_148.m_data[0],&local_108);
          if (local_108.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pCVar20 = local_188;
          local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_148.m_data[0];
          local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_data[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_148.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_148.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_148.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_148.m_data[1] + 8) + 1;
            }
          }
          aCStack_260[0].m_data[1] = local_c8.coord.rot.m_data[3];
          aCStack_260[0].m_data[0] = local_c8.coord.rot.m_data[2];
          local_288 = (undefined1  [8])&PTR__ChFrame_00b03780;
          auStack_278._0_8_ = local_c8.coord.pos.m_data[2];
          auStack_280 = (undefined1  [8])local_c8.coord.pos.m_data[1];
          auStack_278._8_8_ = local_c8.coord.rot.m_data[0];
          dStack_268 = local_c8.coord.rot.m_data[1];
          aCStack_260[0].m_data[2] =
               local_c8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          ChMatrix33<double>::ChMatrix33
                    ((ChMatrix33<double> *)(aCStack_260[0].m_data + 3),
                     (ChQuaternion<double> *)(local_c8.coord.rot.m_data + 1));
          shape = &local_118;
          ChPhysicsItem::AddVisualShape((ChPhysicsItem *)pCVar20,shape,(ChFrame<double> *)local_288)
          ;
          if (local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_data[1]);
          }
        }
        if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
        }
        if (a_Stack_1f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1f0[0]._M_pi);
        }
      }
      local_c8._vptr_ChFrame = (_func_int **)0x0;
      local_c8.coord.pos.m_data[0] = 0.0;
      iVar19 = (*(local_d8->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                         ();
      if (iVar19 == 0) {
        local_288 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_280,
                   (ChMaterialSurfaceNSC **)local_288,
                   (allocator<chrono::ChMaterialSurfaceNSC> *)&local_148);
        ChMaterialSurface::SetFriction((ChMaterialSurface *)local_288,this->m_friction);
        *(float *)((long)local_288 + 0x18) = this->m_restitution;
LAB_0092f5e5:
        local_c8._vptr_ChFrame = (_func_int **)local_288;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8.coord,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_280);
        if (auStack_280 != (undefined1  [8])0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_280);
        }
      }
      else if (iVar19 == 1) {
        local_288 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_280,
                   (ChMaterialSurfaceSMC **)local_288,
                   (allocator<chrono::ChMaterialSurfaceSMC> *)&local_148);
        ChMaterialSurface::SetFriction((ChMaterialSurface *)local_288,this->m_friction);
        *(undefined8 *)((long)local_288 + 0x18) = *(undefined8 *)&this->m_restitution;
        *(float *)&((ChMaterialSurface *)((long)local_288 + 0x20))->_vptr_ChMaterialSurface =
             this->m_poisson_ratio;
        auVar1._0_4_ = this->m_kn;
        auVar1._4_4_ = this->m_gn;
        auVar1._8_4_ = this->m_kt;
        auVar1._12_4_ = this->m_gt;
        auVar40 = vpermilps_avx(auVar1,0xd8);
        pCVar17 = (ChMaterialSurface *)((long)local_288 + 0x20);
        pCVar17->rolling_friction = (float)auVar40._0_4_;
        pCVar17->spinning_friction = (float)auVar40._4_4_;
        pCVar17->restitution = (float)auVar40._8_4_;
        *(int *)&pCVar17->field_0x1c = auVar40._12_4_;
        goto LAB_0092f5e5;
      }
      iVar19 = (*(local_188->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])();
      if ((char)iVar19 != '\0') {
        peVar8 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var6 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        (*peVar8->_vptr_ChCollisionModel[3])();
        pcVar30 = local_180.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar16 = local_180.
                  super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          pcVar30 = local_180.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar16 = local_180.
                    super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pCVar20 = local_188, pcVar30 != pcVar16; pcVar30 = pcVar30 + 1) {
          local_288 = (undefined1  [8])pcVar30->rad;
          hlen = pcVar30->hlen;
          auStack_280 = (undefined1  [8])pcVar30->hlen;
          unique0x1000209d = *(undefined1 (*) [24])&pcVar30->pos;
          aCStack_260[0].m_data = *&(pcVar30->rot).m_data;
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)local_c8._vptr_ChFrame;
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_c8.coord.pos.m_data[0] + 8) =
                   *(_Atomic_word *)((long)local_c8.coord.pos.m_data[0] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_c8.coord.pos.m_data[0] + 8) =
                   *(_Atomic_word *)((long)local_c8.coord.pos.m_data[0] + 8) + 1;
            }
          }
          local_200 = (ChMaterialSurface *)local_288;
          ChVisualMaterial::Default();
          AddCylinderGeometry(&pCVar20->super_ChBody,&local_128,(double)local_200,(double)hlen,
                              (ChVector<double> *)auStack_278,aCStack_260,false,&local_40);
          if (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        peVar8 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var6 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        (*peVar8->_vptr_ChCollisionModel[0x19])(peVar8,local_168 & 0xffffffff);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar8 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var6 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        (*peVar8->_vptr_ChCollisionModel[0x1b])(peVar8,local_168 >> 0x20);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        peVar8 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var6 = (local_188->super_ChBody).collision_model.
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        (*peVar8->_vptr_ChCollisionModel[4])();
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.coord.pos.m_data[0]);
      }
      if (local_180.
          super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.
                        super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1d8.second.cylinders.
          super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.second.cylinders.
                        super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8.second.cylinders.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.second.cylinders.
                              super__Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.first._M_dataplus._M_p != &local_1d8.first.field_2) {
        operator_delete(local_1d8.first._M_dataplus._M_p,
                        local_1d8.first.field_2._M_allocated_capacity + 1);
      }
      p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
    } while (p_Var27 != (_Rb_tree_node_base *)(body_collision_info_abi_cxx11_ + 8));
  }
  return;
}

Assistant:

void ChParserOpenSim::initShapes(rapidxml::xml_node<>* node, ChSystem& system) {
    if (m_verbose)
        std::cout << "Creating collision and visualization shapes " << std::endl;

    // Keep the maximum depth so that we can color appropriately
    int max_depth_level = 0;

    // Go through the motions of constructing collision models, but don't do it until we have all of the necessary info
    for (auto link : m_jointList) {
        auto linkCoords = link->GetLinkAbsoluteCoords();
        // These need to be ChBodyAuxRef, but hopefully that's all that we'll have
        auto parent = dynamic_cast<ChBodyAuxRef*>(link->GetBody1());
        auto child = dynamic_cast<ChBodyAuxRef*>(link->GetBody2());

        // Add pointers to struct if they don't exist, struct entry should be default-constructed
        if (body_collision_info.find(parent->GetName()) == body_collision_info.end()) {
            body_collision_info[parent->GetName()].body = parent;
        }
        if (body_collision_info.find(child->GetName()) == body_collision_info.end()) {
            body_collision_info[child->GetName()].body = child;
        }
        body_collision_struct& parent_col_info = body_collision_info[parent->GetName()];
        body_collision_struct& child_col_info = body_collision_info[child->GetName()];

        // If a body is fixed, treat it as level 0
        if (parent->GetBodyFixed()) {
            parent_col_info.level = 0;
        }
        // Child is one more level than parent
        int child_level = parent_col_info.level + 1;
        // Keep a max depth so we know how to color it
        if (child_level > max_depth_level) {
            max_depth_level = child_level;
        }
        child_col_info.level = child_level;

        ChVector<> p1, p2;
        // Make cylinder from parent to outbound joint
        // First end is at parent COM
        p1 = parent->GetFrame_COG_to_REF().GetPos();
        // Second end is at joint location
        p2 = parent->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p1 - p2);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p1 - p2).Length() / 2;
            new_cyl.pos = (p2 - p1) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[parent->GetName()].cylinders.push_back(new_cyl);
        }

        // First end is at joint location
        p1 = child->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);
        // Second end is at child COM
        p2 = child->GetFrame_COG_to_REF().GetPos();

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p2 - p1);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p2 - p1).Length() / 2;
            new_cyl.pos = (p1 - p2) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[child->GetName()].cylinders.push_back(new_cyl);
        }

        // Make cylinder from child to inbound joint
        if (m_verbose)
            std::cout << parent->GetName() << " family is " << body_collision_info[parent->GetName()].family
                      << std::endl;

        if ((parent->GetCollide() == false) || (body_collision_info[parent->GetName()].family == m_family_2)) {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_1 << std::endl;
            body_collision_info[child->GetName()].family = m_family_1;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_2;
        } else {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_2 << std::endl;
            body_collision_info[child->GetName()].family = m_family_2;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_1;
        }
    }

    // Loop through the list of bodies in the model and create visualization and collision shapes
    for (auto body_info_pair : body_collision_info) {
        auto body_info = body_info_pair.second;

        // Create primitive visualization assets
        if (m_visType == VisType::PRIMITIVES) {
            // Assign a color based on the body's level in the tree hierarchy
            float colorVal = (1.0f * body_info.level) / max_depth_level;
            auto vis_mat = chrono_types::make_shared<ChVisualMaterial>();
            vis_mat->SetDiffuseColor(ChColor(colorVal, 1.0f - colorVal, 0.0f));

            // Create a sphere at the body COM
            auto sphere = chrono_types::make_shared<ChSphereShape>();
            sphere->GetSphereGeometry().rad = 0.1;
            sphere->AddMaterial(vis_mat);
            body_info.body->AddVisualShape(sphere, ChFrame<>(body_info.body->GetFrame_COG_to_REF().GetPos()));

            // Create visualization cylinders
            for (auto cyl_info : body_info.cylinders) {
                auto cylinder = chrono_types::make_shared<ChCylinderShape>();
                cylinder->GetCylinderGeometry().rad = cyl_info.rad;
                cylinder->GetCylinderGeometry().p1 = ChVector<>(0, cyl_info.hlen, 0);
                cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -cyl_info.hlen, 0);
                cylinder->AddMaterial(vis_mat);
                body_info.body->AddVisualShape(cylinder, ChFrame<>(cyl_info.pos, cyl_info.rot));
            }
        }

        // Create a contact material that will be shared by all shapes for this body
        std::shared_ptr<ChMaterialSurface> mat;
        switch (system.GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                matNSC->SetFriction(m_friction);
                matNSC->SetRestitution(m_restitution);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                matSMC->SetFriction(m_friction);
                matSMC->SetRestitution(m_restitution);
                matSMC->SetYoungModulus(m_young_modulus);
                matSMC->SetPoissonRatio(m_poisson_ratio);
                matSMC->SetKn(m_kn);
                matSMC->SetGn(m_gn);
                matSMC->SetKt(m_kt);
                matSMC->SetGt(m_gt);
                mat = matSMC;
                break;
            }
        }

        // Set collision shapes
        if (body_info.body->GetCollide()) {
            body_info.body->GetCollisionModel()->ClearModel();

            for (auto cyl_info : body_info.cylinders) {
                utils::AddCylinderGeometry(body_info.body, mat, cyl_info.rad, cyl_info.hlen, cyl_info.pos, cyl_info.rot,
                                           false);
            }

            body_info.body->GetCollisionModel()->SetFamily(body_info.family);
            body_info.body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(body_info.family_mask_nocollide);

            body_info.body->GetCollisionModel()->BuildModel();
        }
    }
}